

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::SideShapeFunction
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  MElementType MVar4;
  int iVar5;
  int iVar6;
  int64_t iVar7;
  TPZConnect *this_00;
  TPZGeoNode *this_01;
  long *plVar8;
  int *piVar9;
  double *pdVar10;
  TPZVec<double> *in_RDX;
  int in_ESI;
  long *in_RDI;
  int d;
  int i;
  int nshape;
  int kfirst;
  int ifirst;
  int side_1;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> jac;
  int dim;
  TPZGeoElSide gelside;
  REAL detjac;
  int localside;
  int ls;
  TPZManVector<long,_28> FirstIndex;
  int ncs;
  TPZFNMatrix<50,_double> dphiloc;
  TPZFNMatrix<50,_double> philoc;
  int sidedimension;
  TPZManVector<int,_7> ord;
  MElementType sidetype;
  int transformid;
  TPZManVector<int,_9> permutegather;
  int locid;
  int ic_1;
  TPZManVector<long,_8> id;
  int nsn;
  TPZGeoEl *gel;
  int ic;
  int is;
  int order;
  int connectlocid;
  int nsideshape;
  int ncontained;
  undefined4 in_stack_fffffffffffff568;
  int in_stack_fffffffffffff56c;
  TPZManVector<long,_28> *in_stack_fffffffffffff570;
  TPZGeoEl *in_stack_fffffffffffff578;
  TPZGeoEl *in_stack_fffffffffffff580;
  TPZVec<double> *in_stack_fffffffffffff588;
  TPZFNMatrix<50,_double> *in_stack_fffffffffffff590;
  TPZVec<long> *in_stack_fffffffffffff598;
  TPZManVector<long,_28> *in_stack_fffffffffffff5a0;
  TPZVec<long> *in_stack_fffffffffffff5d8;
  int local_9a8;
  int local_9a4;
  int local_994;
  double local_6d0;
  int local_6c4;
  TPZVec<long> local_6b8 [2];
  size_t in_stack_fffffffffffff988;
  char *in_stack_fffffffffffff990;
  TPZVec<int> local_110 [2];
  int local_b8;
  int local_b4;
  TPZVec<long> local_b0 [3];
  int local_4c;
  TPZGeoEl *local_48;
  int local_40;
  int local_3c;
  uint local_38;
  undefined4 local_34;
  int local_30;
  int local_2c;
  int local_c;
  
  local_c = in_ESI;
  if ((in_ESI == 7) || (iVar7 = TPZVec<double>::size(in_RDX), iVar7 != 1)) {
    std::operator<<((ostream *)&std::cout,"Don\'t have side shape associated to this side");
    pzinternal::DebugStopImpl(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
  }
  iVar3 = pztopology::TPZTriangle::SideDimension(0x19ffe2f);
  if (iVar3 == 1) {
    local_2c = pztopology::TPZTriangle::NContainedSides(0x19ffe48);
    local_30 = 0;
    local_34 = (**(code **)(*in_RDI + 0x250))(in_RDI,0,local_c);
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_34);
    bVar2 = TPZConnect::Order(this_00);
    local_38 = (uint)bVar2;
    for (local_3c = 0; local_3c < local_2c; local_3c = local_3c + 1) {
      local_40 = pztopology::TPZTriangle::ContainedSideLocId
                           ((int)in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
      iVar3 = pzshape::TPZShapeTriang::NConnectShapeF
                        ((int)in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
      local_30 = iVar3 + local_30;
    }
    local_48 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffff578);
    local_4c = pztopology::TPZTriangle::NSideNodes(local_c);
    TPZManVector<long,_8>::TPZManVector
              ((TPZManVector<long,_8> *)in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588
              );
    for (local_b4 = 0; local_b4 < local_4c; local_b4 = local_b4 + 1) {
      local_b8 = pztopology::TPZTriangle::SideNodeLocId
                           ((int)in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
      this_01 = TPZGeoEl::Node(in_stack_fffffffffffff580,
                               (int)((ulong)in_stack_fffffffffffff578 >> 0x20));
      iVar3 = TPZGeoNode::Id(this_01);
      plVar8 = TPZVec<long>::operator[](local_b0,(long)local_b4);
      *plVar8 = (long)iVar3;
    }
    TPZManVector<int,_9>::TPZManVector
              ((TPZManVector<int,_9> *)in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588)
    ;
    MVar4 = pztopology::TPZTriangle::Type(local_c);
    if (MVar4 == EOned) {
      pztopology::TPZLine::GetTransformId(&in_stack_fffffffffffff570->super_TPZVec<long>);
      pztopology::TPZLine::GetSideHDivPermutation
                ((int)((ulong)in_stack_fffffffffffff570 >> 0x20),
                 (TPZVec<int> *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    }
    else if (MVar4 == ETriangle) {
      pztopology::TPZTriangle::GetTransformId(in_stack_fffffffffffff598);
      pztopology::TPZTriangle::GetSideHDivPermutation
                ((int)((ulong)in_stack_fffffffffffff570 >> 0x20),
                 (TPZVec<int> *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    }
    else if (MVar4 == EQuadrilateral) {
      pztopology::TPZQuadrilateral::GetTransformId(in_stack_fffffffffffff5d8);
      pztopology::TPZQuadrilateral::GetSideHDivPermutation
                ((int)((ulong)in_stack_fffffffffffff580 >> 0x20),
                 (TPZVec<int> *)in_stack_fffffffffffff578);
    }
    else {
      pzinternal::DebugStopImpl(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    }
    TPZManVector<int,_7>::TPZManVector
              ((TPZManVector<int,_7> *)in_stack_fffffffffffff5a0,(int64_t)in_stack_fffffffffffff598,
               (int *)in_stack_fffffffffffff590);
    iVar3 = pztopology::TPZTriangle::SideDimension(0x1a001b9);
    TPZFNMatrix<50,_double>::TPZFNMatrix
              (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
               (int64_t)in_stack_fffffffffffff580);
    TPZFNMatrix<50,_double>::TPZFNMatrix
              (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
               (int64_t)in_stack_fffffffffffff580);
    pzshape::TPZShapeTriang::SideShape
              ((int)((ulong)in_stack_fffffffffffff590 >> 0x20),in_stack_fffffffffffff588,
               (TPZVec<long> *)in_stack_fffffffffffff580,(TPZVec<int> *)in_stack_fffffffffffff578,
               (TPZFMatrix<double> *)in_stack_fffffffffffff570,
               (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    iVar5 = pztopology::TPZTriangle::NContainedSides(0x1a0024d);
    TPZManVector<long,_28>::TPZManVector
              (in_stack_fffffffffffff5a0,(int64_t)in_stack_fffffffffffff598,
               (long *)in_stack_fffffffffffff590);
    for (local_6c4 = 0; local_6c4 < iVar5; local_6c4 = local_6c4 + 1) {
      pztopology::TPZTriangle::ContainedSideLocId
                ((int)in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
      plVar8 = TPZVec<long>::operator[](local_6b8,(long)local_6c4);
      lVar1 = *plVar8;
      iVar6 = pzshape::TPZShapeTriang::NConnectShapeF
                        ((int)in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
      plVar8 = TPZVec<long>::operator[](local_6b8,(long)(local_6c4 + 1));
      *plVar8 = lVar1 + iVar6;
    }
    local_6d0 = 1.0;
    TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffff578);
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_fffffffffffff580,in_stack_fffffffffffff578,
               (int)((ulong)in_stack_fffffffffffff570 >> 0x20));
    (**(code **)(*(long *)local_48 + 0x208))(local_48,local_c);
    TPZFNMatrix<9,_double>::TPZFNMatrix
              ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff590,
               (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
    TPZFNMatrix<9,_double>::TPZFNMatrix
              ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff590,
               (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
    TPZFNMatrix<9,_double>::TPZFNMatrix
              ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff590,
               (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
    TPZGeoElSide::Jacobian
              ((TPZGeoElSide *)axes.fBuf[1],(TPZVec<double> *)axes.fBuf[0],
               (TPZFMatrix<double> *)axes.super_TPZFMatrix<double>.fWork.fNAlloc,
               (TPZFMatrix<double> *)axes.super_TPZFMatrix<double>.fWork.fNElements,
               axes.super_TPZFMatrix<double>.fWork.fStore,
               (TPZFMatrix<double> *)axes.super_TPZFMatrix<double>.fWork._vptr_TPZVec);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1a004f2);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1a004ff);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1a0050c);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a00519);
    if (MVar4 == ETriangle) {
      local_6d0 = 0.16666666666666666;
    }
    for (local_994 = 0; local_994 < iVar5; local_994 = local_994 + 1) {
      TPZVec<long>::operator[](local_6b8,(long)local_994);
      piVar9 = TPZVec<int>::operator[](local_110,(long)local_994);
      TPZVec<long>::operator[](local_6b8,(long)*piVar9);
      plVar8 = TPZVec<long>::operator[](local_6b8,(long)(local_994 + 1));
      iVar6 = (int)*plVar8;
      plVar8 = TPZVec<long>::operator[](local_6b8,(long)local_994);
      lVar1 = *plVar8;
      for (local_9a4 = 0; local_9a4 < iVar6 - (int)lVar1; local_9a4 = local_9a4 + 1) {
        pdVar10 = TPZFMatrix<double>::operator()
                            (&in_stack_fffffffffffff590->super_TPZFMatrix<double>,
                             (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
        in_stack_fffffffffffff588 = (TPZVec<double> *)(*pdVar10 / local_6d0);
        in_stack_fffffffffffff590 =
             (TPZFNMatrix<50,_double> *)
             TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffff590->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
        (in_stack_fffffffffffff590->super_TPZFMatrix<double>).super_TPZMatrix<double>.
        super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)in_stack_fffffffffffff588;
        for (local_9a8 = 0; local_9a8 < iVar3; local_9a8 = local_9a8 + 1) {
          in_stack_fffffffffffff580 =
               (TPZGeoEl *)
               TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff590->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
          in_stack_fffffffffffff570 =
               (TPZManVector<long,_28> *)(*(double *)in_stack_fffffffffffff580 / local_6d0);
          pdVar10 = TPZFMatrix<double>::operator()
                              (&in_stack_fffffffffffff590->super_TPZFMatrix<double>,
                               (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580
                              );
          *pdVar10 = (double)in_stack_fffffffffffff570;
        }
      }
    }
    TPZManVector<long,_28>::~TPZManVector(in_stack_fffffffffffff570);
    TPZFNMatrix<50,_double>::~TPZFNMatrix((TPZFNMatrix<50,_double> *)0x1a0086d);
    TPZFNMatrix<50,_double>::~TPZFNMatrix((TPZFNMatrix<50,_double> *)0x1a0087a);
    TPZManVector<int,_7>::~TPZManVector((TPZManVector<int,_7> *)in_stack_fffffffffffff570);
    TPZManVector<int,_9>::~TPZManVector((TPZManVector<int,_9> *)in_stack_fffffffffffff570);
    TPZManVector<long,_8>::~TPZManVector((TPZManVector<long,_8> *)in_stack_fffffffffffff570);
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {

    if(side==TSHAPE::NSides || point.size() != TSHAPE::Dimension-1){
        std::cout<<"Don't have side shape associated to this side";
        DebugStop();
    }
	if(TSHAPE::SideDimension(side)!= TSHAPE::Dimension -1 ){
		return ;
	}
    int ncontained = TSHAPE::NContainedSides(side);
    int nsideshape = 0;
    int connectlocid = SideConnectLocId(0, side);
    int order = this->Connect(connectlocid).Order();
    int is;
    for (is=0; is<ncontained; is++) {
        int ic = TSHAPE::ContainedSideLocId(side,is);
        nsideshape += TSHAPE::NConnectShapeF(ic,order);
    }
#ifdef PZDEBUG
    if (nsideshape != this->NSideShapeF(side)) {
        DebugStop();
    }
#endif

    TPZGeoEl *gel = this->Reference();
    //int nc = gel->NCornerNodes();
    int nsn = TSHAPE::NSideNodes(side);
    TPZManVector<int64_t,8> id(nsn);
    for (int ic=0; ic<nsn; ic++) {
        int locid = TSHAPE::SideNodeLocId(side,ic);
        id[ic] = gel->Node(locid).Id();
    }

    //int idsize = id.size();
    TPZManVector<int,9> permutegather(ncontained);
    int transformid;


    MElementType sidetype = TSHAPE::Type(side);
    switch (sidetype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(id);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(id);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(id);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        default:
            DebugStop();
            break;
    }

    TPZManVector<int,TSHAPE::NSides> ord(TSHAPE::NSides,order);

    int sidedimension = TSHAPE::SideDimension(side);
    TPZFNMatrix<50,REAL> philoc(nsideshape,1),dphiloc(sidedimension,nsideshape);

    TSHAPE::SideShape(side,point,id,ord,philoc,dphiloc);

    int ncs = TSHAPE::NContainedSides(side);
    TPZManVector<int64_t,28> FirstIndex(ncs+1,0);
    for (int ls=0; ls<ncs; ls++) {
        int localside = TSHAPE::ContainedSideLocId(side,ls);
        FirstIndex[ls+1] = FirstIndex[ls]+TSHAPE::NConnectShapeF(localside,order);
    }

    REAL detjac = 1.;
    {
        TPZGeoElSide gelside = TPZGeoElSide(this->Reference(),side);
        int dim = gel->SideDimension(side);
        TPZFNMatrix<9,REAL> jac(dim,dim),jacinv(dim,dim),axes(dim,3);
        gelside.Jacobian(point, jac, axes, detjac, jacinv);
    }
    if(sidetype == ETriangle) detjac /= 6.;
    for (int side=0; side < ncs; side++) {
        int ifirst = FirstIndex[side];
        int kfirst = FirstIndex[permutegather[side]];
        int nshape = FirstIndex[side+1]-FirstIndex[side];
        for (int i=0; i<nshape; i++) {
            phi(ifirst+i,0) = philoc(kfirst+i,0)/detjac;
            for (int d=0; d< sidedimension; d++) {
                dphi(d,ifirst+i) = dphiloc(d,kfirst+i)/detjac;
            }
        }
    }

}